

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O1

void __thiscall
ConfidentialTxIn_AddPeginWitnessStack_Test::TestBody
          (ConfidentialTxIn_AddPeginWitnessStack_Test *this)

{
  ByteData *pBVar1;
  undefined8 uVar2;
  bool bVar3;
  char *pcVar4;
  ulong uVar5;
  AssertionResult gtest_ar;
  undefined1 local_278 [16];
  AssertHelper local_268 [2];
  undefined1 local_258 [16];
  AssertionResult gtest_ar_1;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_238;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_220;
  ByteData exp_data;
  ScriptWitness exp_pegin_witness;
  ScriptWitness exp_witness_stack;
  undefined1 local_1b0 [32];
  ConfidentialTxIn txin;
  
  GetExpectWitnessStack();
  GetExpectPeginWitnessStack();
  pBVar1 = &txin.super_AbstractTxIn.txid_.data_;
  txin.super_AbstractTxIn._vptr_AbstractTxIn = (_func_int **)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&txin,"1234567890","");
  cfd::core::ByteData::ByteData(&exp_data,(string *)&txin);
  if ((ByteData *)txin.super_AbstractTxIn._vptr_AbstractTxIn != pBVar1) {
    operator_delete(txin.super_AbstractTxIn._vptr_AbstractTxIn);
  }
  cfd::core::ConfidentialTxIn::ConfidentialTxIn
            (&txin,&exp_txid,2,0xfffffffe,&exp_script,&exp_witness_stack,&exp_blinding_nonce,
             &exp_asset_entropy,&exp_issuance_amount,&exp_inflation_keys,
             &exp_issuance_amount_rangeproof,&exp_inflation_keys_rangeproof,&exp_pegin_witness);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::ConfidentialTxIn::AddPeginWitnessStack((ByteData *)local_1b0);
      local_1b0._0_8_ = &PTR__ScriptWitness_004e4f88;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 (local_1b0 + 8));
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              (local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0xae,
               "Expected: (txin.AddPeginWitnessStack(exp_data)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(local_268,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(local_268);
    if (gtest_ar._0_8_ != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  local_268[0].data_._0_4_ = cfd::core::ScriptWitness::GetWitnessNum();
  local_238.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = cfd::core::ScriptWitness::GetWitnessNum();
  local_238.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ =
       (int)local_238.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
            _M_impl.super__Vector_impl_data._M_start + 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"txin.GetPeginWitnessStackNum()",
             "exp_pegin_witness.GetWitnessNum() + 1",(uint *)local_268,(uint *)&local_238);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_268);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0xb0,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_238,(Message *)local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_238);
    if (local_268[0].data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_268[0].data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_268[0].data_ + 8))();
      }
      local_268[0].data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar._0_8_ = &PTR__ScriptWitness_004e4f88;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar.message_
             ,&txin.pegin_witness_.witness_stack_);
  cfd::core::ScriptWitness::GetWitness();
  gtest_ar._0_8_ = &PTR__ScriptWitness_004e4f88;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar.message_
            );
  cfd::core::ScriptWitness::GetWitness();
  if (local_220.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_220.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar5 = 0;
    do {
      cfd::core::ByteData::GetHex_abi_cxx11_();
      uVar2 = gtest_ar._0_8_;
      cfd::core::ByteData::GetHex_abi_cxx11_();
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar_1,"test_peg_vector[idx].GetHex().c_str()",
                 "exp_peg_vector[idx].GetHex().c_str()",(char *)uVar2,(char *)local_268[0].data_);
      if (local_268[0].data_ != (AssertHelperData *)local_258) {
        operator_delete(local_268[0].data_);
      }
      if ((undefined1 *)gtest_ar._0_8_ != local_278) {
        operator_delete((void *)gtest_ar._0_8_);
      }
      if (gtest_ar_1.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar);
        pcVar4 = "";
        if (gtest_ar_1.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (local_268,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                   ,0xb6,pcVar4);
        testing::internal::AssertHelper::operator=(local_268,(Message *)&gtest_ar);
        testing::internal::AssertHelper::~AssertHelper(local_268);
        if (gtest_ar._0_8_ != 0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) && (gtest_ar._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
          }
          gtest_ar.success_ = false;
          gtest_ar._1_7_ = 0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_1.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)(((long)local_220.
                                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_220.
                                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  cfd::core::ByteData::GetHex_abi_cxx11_();
  uVar2 = gtest_ar._0_8_;
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_1,"test_peg_vector[target_index].GetHex().c_str()",
             "exp_data.GetHex().c_str()",(char *)uVar2,(char *)local_268[0].data_);
  if (local_268[0].data_ != (AssertHelperData *)local_258) {
    operator_delete(local_268[0].data_);
  }
  if ((undefined1 *)gtest_ar._0_8_ != local_278) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0xb9,pcVar4);
    testing::internal::AssertHelper::operator=(local_268,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(local_268);
    if (gtest_ar._0_8_ != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_1.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialTxIn::GetWitnessHash();
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_1,"txin.GetWitnessHash().GetHex().c_str()",
             "\"d4fa3782068f8f1cef563520691eafbc883d1caf1d928012462644c7148cf1d5\"",
             (char *)gtest_ar._0_8_,
             "d4fa3782068f8f1cef563520691eafbc883d1caf1d928012462644c7148cf1d5");
  if ((undefined1 *)gtest_ar._0_8_ != local_278) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  if (local_268[0].data_ != (AssertHelperData *)0x0) {
    operator_delete(local_268[0].data_);
  }
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0xbb,pcVar4);
    testing::internal::AssertHelper::operator=(local_268,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(local_268);
    if (gtest_ar._0_8_ != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_1.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_220);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_238);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&txin);
  if (exp_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(exp_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  exp_pegin_witness._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_004e4f88;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&exp_pegin_witness.witness_stack_);
  exp_witness_stack._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_004e4f88;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&exp_witness_stack.witness_stack_);
  return;
}

Assistant:

TEST(ConfidentialTxIn, AddPeginWitnessStack) {
  ScriptWitness exp_witness_stack = GetExpectWitnessStack();
  ScriptWitness exp_pegin_witness = GetExpectPeginWitnessStack();
  const ByteData exp_data("1234567890");
  uint32_t target_index = 6;

  ConfidentialTxIn txin(exp_txid, exp_index, exp_sequence, exp_script,
      exp_witness_stack, exp_blinding_nonce, exp_asset_entropy,
      exp_issuance_amount, exp_inflation_keys, exp_issuance_amount_rangeproof,
      exp_inflation_keys_rangeproof, exp_pegin_witness);
  EXPECT_NO_THROW((txin.AddPeginWitnessStack(exp_data)));
  EXPECT_EQ(txin.GetPeginWitnessStackNum(),
      exp_pegin_witness.GetWitnessNum() + 1);
  const std::vector<ByteData>& test_peg_vector = txin.GetPeginWitness()
      .GetWitness();
  const std::vector<ByteData>& exp_peg_vector = exp_pegin_witness.GetWitness();
  for (size_t idx = 0; idx < exp_peg_vector.size(); ++idx) {
    EXPECT_STREQ(test_peg_vector[idx].GetHex().c_str(),
        exp_peg_vector[idx].GetHex().c_str());
  }
  EXPECT_STREQ(test_peg_vector[target_index].GetHex().c_str(),
      exp_data.GetHex().c_str());
  EXPECT_STREQ(txin.GetWitnessHash().GetHex().c_str(), 
    "d4fa3782068f8f1cef563520691eafbc883d1caf1d928012462644c7148cf1d5");
}